

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::
EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test::TestBody
          (EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test
           *this)

{
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_00;
  TableauPileMock *this_01;
  PileId local_5c;
  undefined1 local_58 [4];
  PileId local_54;
  _Any_data local_50 [2];
  undefined1 *local_30;
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_28;
  
  local_50[0]._M_unused._M_object = (void *)0x3300000018;
  local_50[0]._M_pod_data[8] = '\x01';
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)local_50);
  EventsProcessorTests::ignoreLeftButtonDownOnButtons(&this->super_EventsProcessorTests);
  EventsProcessorTests::ignoreLeftButtonDownOnFoundationPilesFromFirstTo
            (&this->super_EventsProcessorTests,4);
  EventsProcessorTests::ignoreLeftButtonDownOnTableauPilesFromFirstTo
            (&this->super_EventsProcessorTests,6);
  local_54.t = (anonymous_namespace)::lastTableauPileId;
  EventsProcessorTests::acceptLeftButtonDownOnTableauPileCard
            (&this->super_EventsProcessorTests,&local_54,2,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent);
  this_01 = (TableauPileMock *)local_58;
  local_58 = (undefined1  [4])(anonymous_namespace)::lastTableauPileId;
  EventsProcessorTests::expectGetTableauPileAndItsCollider
            (&this->super_EventsProcessorTests,(PileId *)this_01);
  local_28.function_mocker_ =
       (FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
        *)piles::TableauPileMock::gmock_getCards
                    ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)&(this->super_EventsProcessorTests).tableauPileMock,this_01);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      (&local_28,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x142,"tableauPileMock","getCards()");
  local_30 = (anonymous_namespace)::cards;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
              *)local_50,(ReturnRefAction *)&local_30);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_00,(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_50);
  local_5c.t = (anonymous_namespace)::lastTableauPileId;
  EventsProcessorTests::expectTryPullOutCardsFromTableauPile
            (&this->super_EventsProcessorTests,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent,&local_5c,2,
             (int)((ulong)((anonymous_namespace)::cards._8_8_ - (anonymous_namespace)::cards._0_8_)
                  >> 3) - 2);
  local_50[0]._M_pod_data[8] = '\x04';
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)local_50);
  EventsProcessor::processEvents(&(this->super_EventsProcessorTests).eventsProcessor);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount - 1);
    acceptLeftButtonDownOnTableauPileCard(
        lastTableauPileId, middleTableauPileCardIndex, mouseLeftButtonDownEvent);
    expectGetTableauPileAndItsCollider(lastTableauPileId);
    EXPECT_CALL(tableauPileMock, getCards()).WillOnce(ReturnRef(cards));
    expectTryPullOutCardsFromTableauPile(
        mouseLeftButtonDownEvent, lastTableauPileId,
        middleTableauPileCardIndex, cards.size() - middleTableauPileCardIndex);
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}